

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsAllowedSampledImageOperand(Op opcode,ValidationState_t *_)

{
  bool bVar1;
  ValidationState_t *__local;
  Op opcode_local;
  
  if (opcode == OpStore) {
    bVar1 = ValidationState_t::HasCapability(_,BindlessTextureNV);
    if (bVar1) {
      __local._7_1_ = true;
    }
    else {
      __local._7_1_ = false;
    }
  }
  else if ((((((opcode == OpCopyObject) || (opcode - OpSampledImage < 9)) ||
             (opcode - OpImageGather < 2)) || ((opcode == OpImage || (opcode == OpImageQueryLod))))
           || ((opcode - OpImageSparseSampleImplicitLod < 4 ||
               ((opcode - OpImageSparseGather < 2 || (opcode - OpImageSampleWeightedQCOM < 4))))))
          || ((opcode - OpImageBlockMatchWindowSSDQCOM < 4 || (opcode == OpImageSampleFootprintNV)))
          ) {
    __local._7_1_ = true;
  }
  else {
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool IsAllowedSampledImageOperand(spv::Op opcode, ValidationState_t& _) {
  switch (opcode) {
    case spv::Op::OpSampledImage:
    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImage:
    case spv::Op::OpImageQueryLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
    case spv::Op::OpCopyObject:
    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
    case spv::Op::OpImageSampleFootprintNV:
      return true;
    case spv::Op::OpStore:
      if (_.HasCapability(spv::Capability::BindlessTextureNV)) return true;
      return false;
    default:
      return false;
  }
}